

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

void __thiscall Assimp::XFileParser::ParseDataObjectMeshNormals(XFileParser *this,Mesh *pMesh)

{
  reference pvVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  uint local_b0;
  uint local_ac;
  reference pvStack_a8;
  uint b;
  Face *face;
  uint local_84;
  uint local_80;
  uint numIndices;
  uint a_1;
  allocator<char> local_69;
  string local_68;
  uint local_44;
  undefined8 uStack_40;
  uint numFaces;
  float local_38;
  undefined8 local_2c;
  float local_24;
  uint local_20;
  uint local_1c;
  uint a;
  uint numNormals;
  Mesh *pMesh_local;
  XFileParser *this_local;
  
  _a = pMesh;
  pMesh_local = (Mesh *)this;
  readHeadOfDataObject(this,(string *)0x0);
  local_1c = ReadInt(this);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
            (&_a->mNormals,(ulong)local_1c);
  for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
    _uStack_40 = ReadVector3(this);
    local_2c = uStack_40;
    local_24 = local_38;
    pvVar1 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                       (&_a->mNormals,(ulong)local_20);
    pvVar1->x = (float)(undefined4)local_2c;
    pvVar1->y = (float)local_2c._4_4_;
    pvVar1->z = local_24;
  }
  local_44 = ReadInt(this);
  uVar2 = (ulong)local_44;
  sVar3 = std::vector<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>::size
                    (&_a->mPosFaces);
  if (uVar2 == sVar3) {
    if (local_44 != 0) {
      std::vector<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>::resize
                (&_a->mNormFaces,(ulong)local_44);
      for (local_80 = 0; local_80 < local_44; local_80 = local_80 + 1) {
        local_84 = ReadInt(this);
        memset(&face,0,0x18);
        XFile::Face::Face((Face *)&face);
        pvVar4 = std::vector<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>::operator[]
                           (&_a->mNormFaces,(ulong)local_80);
        XFile::Face::operator=(pvVar4,(Face *)&face);
        XFile::Face::~Face((Face *)&face);
        pvStack_a8 = std::vector<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>::
                     operator[](&_a->mNormFaces,(ulong)local_80);
        for (local_ac = 0; pvVar4 = pvStack_a8, local_ac < local_84; local_ac = local_ac + 1) {
          local_b0 = ReadInt(this);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&pvVar4->mIndices,&local_b0);
        }
        TestForSeparator(this);
      }
    }
    CheckForClosingBrace(this);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Normal face count does not match vertex face count.",&local_69);
  ThrowException(this,&local_68);
}

Assistant:

void XFileParser::ParseDataObjectMeshNormals( Mesh* pMesh)
{
    readHeadOfDataObject();

    // read count
    unsigned int numNormals = ReadInt();
    pMesh->mNormals.resize( numNormals);

    // read normal vectors
    for( unsigned int a = 0; a < numNormals; ++a) {
        pMesh->mNormals[a] = ReadVector3();
    }

    // read normal indices
    unsigned int numFaces = ReadInt();
    if( numFaces != pMesh->mPosFaces.size()) {
        ThrowException( "Normal face count does not match vertex face count.");
    }

    // do not crah when no face definitions are there
    if (numFaces > 0) {
        // normal face creation
        pMesh->mNormFaces.resize( numFaces );
        for( unsigned int a = 0; a < numFaces; ++a ) {
            unsigned int numIndices = ReadInt();
            pMesh->mNormFaces[a] = Face();
            Face& face = pMesh->mNormFaces[a];
            for( unsigned int b = 0; b < numIndices; ++b ) {
                face.mIndices.push_back( ReadInt());
            }

            TestForSeparator();
        }
    }

    CheckForClosingBrace();
}